

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate(QNetworkReplyHttpImplPrivate *this)

{
  long lVar1;
  QUrl *in_RDI;
  long in_FS_OFFSET;
  QDecompressHelper *this_00;
  QUrl *url;
  QUrl in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  url = in_RDI;
  QNetworkReplyPrivate::QNetworkReplyPrivate((QNetworkReplyPrivate *)in_stack_fffffffffffffff0.d);
  in_RDI->d = (QUrlPrivate *)&PTR__QNetworkReplyHttpImplPrivate_0049ecc8;
  in_RDI[0x46].d = (QUrlPrivate *)0x0;
  in_RDI[0x47].d = (QUrlPrivate *)0x0;
  this_00 = (QDecompressHelper *)(in_RDI + 0x48);
  QUrl::QUrl((QUrl *)&stack0xfffffffffffffff0);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)in_stack_fffffffffffffff0.d,url,
             (Operation)((ulong)in_RDI >> 0x20),(Priority)in_RDI);
  QUrl::~QUrl((QUrl *)&stack0xfffffffffffffff0);
  *(undefined1 *)&in_RDI[0x4a].d = 0;
  *(undefined4 *)((long)&in_RDI[0x4a].d + 4) = 0;
  *(undefined4 *)&in_RDI[0x4b].d = 0;
  QString::QString((QString *)0x3162d5);
  std::shared_ptr<QNonContiguousByteDevice>::shared_ptr
            ((shared_ptr<QNonContiguousByteDevice> *)0x3162e6);
  in_RDI[0x51].d = (QUrlPrivate *)0x0;
  *(undefined1 *)&in_RDI[0x52].d = 0;
  in_RDI[0x53].d = (QUrlPrivate *)0x0;
  std::shared_ptr<QRingBuffer>::shared_ptr((shared_ptr<QRingBuffer> *)0x316314);
  in_RDI[0x56].d = (QUrlPrivate *)0xffffffffffffffff;
  in_RDI[0x57].d = (QUrlPrivate *)0x0;
  *(undefined1 *)&in_RDI[0x58].d = 0;
  in_RDI[0x59].d = (QUrlPrivate *)0x0;
  *(undefined1 *)&in_RDI[0x5a].d = 0;
  QUrl::QUrl(in_RDI + 0x5b);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x316365);
  in_RDI[0x5d].d = (QUrlPrivate *)0x0;
  in_RDI[0x5e].d = (QUrlPrivate *)0x0;
  in_RDI[0x5f].d = (QUrlPrivate *)0x0;
  in_RDI[0x60].d = (QUrlPrivate *)0x0;
  in_RDI[0x61].d = (QUrlPrivate *)0x0;
  in_RDI[0x62].d = (QUrlPrivate *)0x0;
  in_RDI[99].d = (QUrlPrivate *)0x0;
  QSharedPointer<char>::QSharedPointer((QSharedPointer<char> *)this_00);
  in_RDI[0x66].d = (QUrlPrivate *)0x0;
  std::make_shared<QAtomicInt>();
  std::make_shared<QAtomicInt>();
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
             (in_RDI + 0x6b),(QSslConfiguration *)0x0);
  *(undefined1 *)&in_RDI[0x6c].d = 0;
  QList<QSslError>::QList((QList<QSslError> *)0x31641d);
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)this_00);
  QDecompressHelper::QDecompressHelper(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate()
    : QNetworkReplyPrivate()
    , manager(nullptr)
    , managerPrivate(nullptr)
    , synchronous(false)
    , state(Idle)
    , statusCode(0)
    , uploadByteDevicePosition(false)
    , uploadDeviceChoking(false)
    , outgoingData(nullptr)
    , bytesUploaded(-1)
    , cacheLoadDevice(nullptr)
    , loadingFromCache(false)
    , cacheSaveDevice(nullptr)
    , cacheEnabled(false)
    , resumeOffset(0)
    , bytesDownloaded(0)
    , bytesBuffered(0)
    , transferTimeout(nullptr)
    , downloadBufferReadPosition(0)
    , downloadBufferCurrentSize(0)
    , downloadZerocopyBuffer(nullptr)
    , pendingDownloadDataEmissions(std::make_shared<QAtomicInt>())
    , pendingDownloadProgressEmissions(std::make_shared<QAtomicInt>())
    #ifndef QT_NO_SSL
    , pendingIgnoreAllSslErrors(false)
    #endif

{
}